

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O2

void __thiscall
hanabi_learning_env::HanabiHand::HanabiHand
          (HanabiHand *this,HanabiHand *hand,bool hide_cards,bool hide_knowledge)

{
  pointer pHVar1;
  pointer pHVar2;
  pointer pCVar3;
  undefined7 in_register_00000011;
  CardKnowledge local_90;
  
  (this->card_knowledge_).
  super__Vector_base<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->card_knowledge_).
  super__Vector_base<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cards_).
  super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->card_knowledge_).
  super__Vector_base<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cards_).
  super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cards_).
  super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000011,hide_cards) == 0) {
    std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
    operator=(&this->cards_,&hand->cards_);
  }
  else {
    local_90.color_.value_ = -1;
    local_90.color_._4_4_ = 0xffffffff;
    std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
    resize(&this->cards_,
           (long)(hand->cards_).
                 super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(hand->cards_).
                 super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)&local_90);
  }
  if (hide_knowledge) {
    pHVar1 = (hand->cards_).
             super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pHVar2 = (hand->cards_).
             super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pHVar1 != pHVar2) {
      pCVar3 = (hand->card_knowledge_).
               super__Vector_base<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
               ._M_impl.super__Vector_impl_data._M_start;
      CardKnowledge::CardKnowledge
                (&local_90,
                 (*(int *)&(((_Bit_iterator *)
                            ((long)&(pCVar3->color_).value_plausible_.
                                    super__Bvector_base<std::allocator<bool>_> + 0x10))->
                           super__Bit_iterator_base)._M_p -
                 *(int *)&(pCVar3->color_).value_plausible_.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data) * 8 +
                 *(uint *)((long)&(pCVar3->color_).value_plausible_.
                                  super__Bvector_base<std::allocator<bool>_> + 0x18),
                 (*(int *)&(((_Bit_iterator *)
                            ((long)&(pCVar3->rank_).value_plausible_.
                                    super__Bvector_base<std::allocator<bool>_> + 0x10))->
                           super__Bit_iterator_base)._M_p -
                 *(int *)&(pCVar3->rank_).value_plausible_.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data) * 8 +
                 *(uint *)((long)&(pCVar3->rank_).value_plausible_.
                                  super__Bvector_base<std::allocator<bool>_> + 0x18));
      std::
      vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
      ::resize(&this->card_knowledge_,(long)pHVar2 - (long)pHVar1 >> 3,&local_90);
      CardKnowledge::~CardKnowledge(&local_90);
      return;
    }
  }
  std::
  vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
  ::operator=(&this->card_knowledge_,&hand->card_knowledge_);
  return;
}

Assistant:

HanabiHand::HanabiHand(const HanabiHand& hand, bool hide_cards,
                       bool hide_knowledge) {
  if (hide_cards) {
    cards_.resize(hand.cards_.size(), HanabiCard());
  } else {
    cards_ = hand.cards_;
  }
  if (hide_knowledge && !hand.cards_.empty()) {
    card_knowledge_.resize(hand.cards_.size(),
                           CardKnowledge(hand.card_knowledge_[0].NumColors(),
                                         hand.card_knowledge_[0].NumRanks()));
  } else {
    card_knowledge_ = hand.card_knowledge_;
  }
}